

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-test.cc
# Opt level: O0

void __thiscall FormatterTest_ArgErrors_Test::TestBody(FormatterTest_ArgErrors_Test *this)

{
  bool bVar1;
  format_error *e_8;
  bool gtest_caught_expected_8;
  string gtest_expected_message_8;
  AssertionResult gtest_ar_8;
  format_error *e_7;
  bool gtest_caught_expected_7;
  string gtest_expected_message_7;
  AssertionResult gtest_ar_7;
  format_error *e_6;
  bool gtest_caught_expected_6;
  string gtest_expected_message_6;
  AssertionResult gtest_ar_6;
  format_error *e_5;
  bool gtest_caught_expected_5;
  string gtest_expected_message_5;
  AssertionResult gtest_ar_5;
  char format_str [256];
  format_error *e_4;
  bool gtest_caught_expected_4;
  string gtest_expected_message_4;
  AssertionResult gtest_ar_4;
  format_error *e_3;
  bool gtest_caught_expected_3;
  string gtest_expected_message_3;
  AssertionResult gtest_ar_3;
  format_error *e_2;
  bool gtest_caught_expected_2;
  string gtest_expected_message_2;
  AssertionResult gtest_ar_2;
  format_error *e_1;
  bool gtest_caught_expected_1;
  string gtest_expected_message_1;
  AssertionResult gtest_ar_1;
  format_error *e;
  bool gtest_caught_expected;
  string gtest_expected_message;
  AssertionResult gtest_ar;
  AssertHelper *in_stack_fffffffffffff7d0;
  char *in_stack_fffffffffffff7e0;
  int in_stack_fffffffffffff7ec;
  char *in_stack_fffffffffffff7f0;
  undefined4 in_stack_fffffffffffff7f8;
  Type in_stack_fffffffffffff7fc;
  AssertionResult *in_stack_fffffffffffff800;
  char (*in_stack_fffffffffffff808) [256];
  AssertionResult *this_00;
  undefined7 in_stack_fffffffffffff848;
  undefined1 in_stack_fffffffffffff84f;
  allocator *in_stack_fffffffffffff850;
  string local_548 [38];
  byte local_522;
  undefined1 local_521 [33];
  AssertionResult local_500 [3];
  string local_4d0 [38];
  byte local_4aa;
  allocator local_4a9;
  string local_4a8 [32];
  AssertionResult local_488 [3];
  string local_458 [38];
  byte local_432;
  allocator local_431;
  string local_430 [32];
  AssertionResult local_410 [3];
  string local_3e0 [38];
  byte local_3ba;
  allocator local_3b9;
  string local_3b8 [32];
  AssertionResult local_398;
  char local_388 [300];
  undefined4 local_25c;
  string local_258 [38];
  byte local_232;
  allocator local_231;
  string local_230 [32];
  AssertionResult local_210 [3];
  string local_1e0 [38];
  byte local_1ba;
  allocator local_1b9;
  string local_1b8 [32];
  AssertionResult local_198 [3];
  string local_168 [38];
  byte local_142;
  allocator local_141;
  string local_140 [32];
  AssertionResult local_120 [3];
  string local_f0 [38];
  byte local_ca;
  allocator local_c9;
  string local_c8 [32];
  AssertionResult local_a8 [3];
  int local_74;
  string local_70 [38];
  byte local_4a;
  allocator local_49;
  string local_48 [48];
  AssertionResult local_18;
  
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_18);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"invalid format string",&local_49);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    local_4a = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[2]>((char (*) [2])in_stack_fffffffffffff808);
      std::__cxx11::string::~string(local_70);
    }
    if ((local_4a & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffff800,
                 (char (*) [93])CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
      local_74 = 2;
    }
    else {
      local_74 = 0;
    }
    std::__cxx11::string::~string(local_48);
    if (local_74 != 0) goto LAB_0012ff10;
  }
  else {
LAB_0012ff10:
    testing::Message::Message((Message *)in_stack_fffffffffffff800);
    testing::AssertionResult::failure_message((AssertionResult *)0x12ff2c);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff800,in_stack_fffffffffffff7fc,
               in_stack_fffffffffffff7f0,in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff850,
               (Message *)CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff7d0);
    testing::Message::~Message((Message *)0x12ff8f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x12ffe7);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_a8);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_c8,"invalid format string",&local_c9);
    std::allocator<char>::~allocator((allocator<char> *)&local_c9);
    local_ca = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[4]>((char (*) [4])in_stack_fffffffffffff808);
      std::__cxx11::string::~string(local_f0);
    }
    if ((local_ca & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffff800,
                 (char (*) [95])CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
      local_74 = 3;
    }
    else {
      local_74 = 0;
    }
    std::__cxx11::string::~string(local_c8);
    if (local_74 != 0) goto LAB_0013037a;
  }
  else {
LAB_0013037a:
    testing::Message::Message((Message *)in_stack_fffffffffffff800);
    testing::AssertionResult::failure_message((AssertionResult *)0x130396);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff800,in_stack_fffffffffffff7fc,
               in_stack_fffffffffffff7f0,in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff850,
               (Message *)CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff7d0);
    testing::Message::~Message((Message *)0x1303f9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x130451);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_120);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_140,"invalid format string",&local_141);
    std::allocator<char>::~allocator((allocator<char> *)&local_141);
    local_142 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[3]>((char (*) [3])in_stack_fffffffffffff808);
      std::__cxx11::string::~string(local_168);
    }
    if ((local_142 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffff800,
                 (char (*) [94])CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
      local_74 = 4;
    }
    else {
      local_74 = 0;
    }
    std::__cxx11::string::~string(local_140);
    if (local_74 != 0) goto LAB_001307e4;
  }
  else {
LAB_001307e4:
    testing::Message::Message((Message *)in_stack_fffffffffffff800);
    testing::AssertionResult::failure_message((AssertionResult *)0x130800);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff800,in_stack_fffffffffffff7fc,
               in_stack_fffffffffffff7f0,in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff850,
               (Message *)CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff7d0);
    testing::Message::~Message((Message *)0x130863);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1308bb);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_198);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_1b8,"argument index out of range",&local_1b9);
    std::allocator<char>::~allocator((allocator<char> *)&local_1b9);
    local_1ba = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[4]>((char (*) [4])in_stack_fffffffffffff808);
      std::__cxx11::string::~string(local_1e0);
    }
    if ((local_1ba & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffff800,
                 (char (*) [95])CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
      local_74 = 5;
    }
    else {
      local_74 = 0;
    }
    std::__cxx11::string::~string(local_1b8);
    if (local_74 != 0) goto LAB_00130c4e;
  }
  else {
LAB_00130c4e:
    testing::Message::Message((Message *)in_stack_fffffffffffff800);
    testing::AssertionResult::failure_message((AssertionResult *)0x130c6a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff800,in_stack_fffffffffffff7fc,
               in_stack_fffffffffffff7f0,in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff850,
               (Message *)CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff7d0);
    testing::Message::~Message((Message *)0x130ccd);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x130d25);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_210);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_230,"invalid format string",&local_231);
    std::allocator<char>::~allocator((allocator<char> *)&local_231);
    local_232 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      local_25c = 0x2a;
      fmt::v5::format<char[5],int>
                ((char (*) [5])in_stack_fffffffffffff808,(int *)in_stack_fffffffffffff800);
      std::__cxx11::string::~string(local_258);
    }
    if ((local_232 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffff800,
                 (char (*) [100])CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
      local_74 = 6;
    }
    else {
      local_74 = 0;
    }
    std::__cxx11::string::~string(local_230);
    if (local_74 != 0) goto LAB_001310cb;
  }
  else {
LAB_001310cb:
    testing::Message::Message((Message *)in_stack_fffffffffffff800);
    testing::AssertionResult::failure_message((AssertionResult *)0x1310e7);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff800,in_stack_fffffffffffff7fc,
               in_stack_fffffffffffff7f0,in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff850,
               (Message *)CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff7d0);
    testing::Message::~Message((Message *)0x13114a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1311a2);
  safe_sprintf<256ul>((char (*) [256])local_388,"{%u",0x7fffffff);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_398);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_3b8,"invalid format string",&local_3b9);
    std::allocator<char>::~allocator((allocator<char> *)&local_3b9);
    local_3ba = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[256]>(in_stack_fffffffffffff808);
      std::__cxx11::string::~string(local_3e0);
    }
    if ((local_3ba & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffff800,
                 (char (*) [100])CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
      local_74 = 7;
    }
    else {
      local_74 = 0;
    }
    std::__cxx11::string::~string(local_3b8);
    if (local_74 != 0) goto LAB_00131551;
  }
  else {
LAB_00131551:
    testing::Message::Message((Message *)in_stack_fffffffffffff800);
    testing::AssertionResult::failure_message((AssertionResult *)0x13156d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff800,in_stack_fffffffffffff7fc,
               in_stack_fffffffffffff7f0,in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff850,
               (Message *)CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff7d0);
    testing::Message::~Message((Message *)0x1315d0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x131628);
  safe_sprintf<256ul>((char (*) [256])local_388,"{%u}",0x7fffffff);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_410);
  if (bVar1) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_430,"argument index out of range",&local_431);
    std::allocator<char>::~allocator((allocator<char> *)&local_431);
    local_432 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      fmt::v5::format<char[256]>(in_stack_fffffffffffff808);
      std::__cxx11::string::~string(local_458);
    }
    if ((local_432 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffff800,
                 (char (*) [100])CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
      local_74 = 8;
    }
    else {
      local_74 = 0;
    }
    std::__cxx11::string::~string(local_430);
    if (local_74 != 0) goto LAB_001319d7;
  }
  else {
LAB_001319d7:
    testing::Message::Message((Message *)in_stack_fffffffffffff800);
    testing::AssertionResult::failure_message((AssertionResult *)0x1319f3);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff800,in_stack_fffffffffffff7fc,
               in_stack_fffffffffffff7f0,in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff850,
               (Message *)CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff7d0);
    testing::Message::~Message((Message *)0x131a56);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x131aae);
  safe_sprintf<256ul>((char (*) [256])local_388,"{%u",0x80000000);
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_488);
  if (bVar1) {
    in_stack_fffffffffffff850 = &local_4a9;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_4a8,"number is too big",in_stack_fffffffffffff850);
    std::allocator<char>::~allocator((allocator<char> *)&local_4a9);
    local_4aa = 0;
    in_stack_fffffffffffff84f = testing::internal::AlwaysTrue();
    if ((bool)in_stack_fffffffffffff84f) {
      fmt::v5::format<char[256]>(in_stack_fffffffffffff808);
      std::__cxx11::string::~string(local_4d0);
    }
    if ((local_4aa & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffff800,
                 (char (*) [100])CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
      local_74 = 9;
    }
    else {
      local_74 = 0;
    }
    std::__cxx11::string::~string(local_4a8);
    if (local_74 != 0) goto LAB_00131e3f;
  }
  else {
LAB_00131e3f:
    testing::Message::Message((Message *)in_stack_fffffffffffff800);
    testing::AssertionResult::failure_message((AssertionResult *)0x131e5b);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff800,in_stack_fffffffffffff7fc,
               in_stack_fffffffffffff7f0,in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e0);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff850,
               (Message *)CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
    testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff7d0);
    testing::Message::~Message((Message *)0x131eb8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x131f10);
  safe_sprintf<256ul>((char (*) [256])local_388,"{%u}",0x80000000);
  this_00 = local_500;
  testing::AssertionSuccess();
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_00);
  if (bVar1) {
    in_stack_fffffffffffff800 = (AssertionResult *)local_521;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_521 + 1),"number is too big",(allocator *)in_stack_fffffffffffff800)
    ;
    std::allocator<char>::~allocator((allocator<char> *)local_521);
    local_522 = 0;
    bVar1 = testing::internal::AlwaysTrue();
    in_stack_fffffffffffff7fc = CONCAT13(bVar1,(int3)in_stack_fffffffffffff7fc);
    if (bVar1) {
      fmt::v5::format<char[256]>(&this_00->success_);
      std::__cxx11::string::~string(local_548);
    }
    if ((local_522 & 1) == 0) {
      testing::AssertionResult::operator<<
                (in_stack_fffffffffffff800,
                 (char (*) [100])CONCAT44(in_stack_fffffffffffff7fc,in_stack_fffffffffffff7f8));
      local_74 = 10;
    }
    else {
      local_74 = 0;
    }
    std::__cxx11::string::~string((string *)(local_521 + 1));
    if (local_74 == 0) goto LAB_00132342;
  }
  testing::Message::Message((Message *)in_stack_fffffffffffff800);
  testing::AssertionResult::failure_message((AssertionResult *)0x13229f);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)in_stack_fffffffffffff800,in_stack_fffffffffffff7fc,
             in_stack_fffffffffffff7f0,in_stack_fffffffffffff7ec,in_stack_fffffffffffff7e0);
  testing::internal::AssertHelper::operator=
            ((AssertHelper *)in_stack_fffffffffffff850,
             (Message *)CONCAT17(in_stack_fffffffffffff84f,in_stack_fffffffffffff848));
  testing::internal::AssertHelper::~AssertHelper(in_stack_fffffffffffff7d0);
  testing::Message::~Message((Message *)0x1322fa);
LAB_00132342:
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x13234f);
  return;
}

Assistant:

TEST(FormatterTest, ArgErrors) {
  EXPECT_THROW_MSG(format("{"), format_error, "invalid format string");
  EXPECT_THROW_MSG(format("{?}"), format_error, "invalid format string");
  EXPECT_THROW_MSG(format("{0"), format_error, "invalid format string");
  EXPECT_THROW_MSG(format("{0}"), format_error, "argument index out of range");
  EXPECT_THROW_MSG(format("{00}", 42), format_error, "invalid format string");

  char format_str[BUFFER_SIZE];
  safe_sprintf(format_str, "{%u", INT_MAX);
  EXPECT_THROW_MSG(format(format_str), format_error, "invalid format string");
  safe_sprintf(format_str, "{%u}", INT_MAX);
  EXPECT_THROW_MSG(format(format_str), format_error,
      "argument index out of range");

  safe_sprintf(format_str, "{%u", INT_MAX + 1u);
  EXPECT_THROW_MSG(format(format_str), format_error, "number is too big");
  safe_sprintf(format_str, "{%u}", INT_MAX + 1u);
  EXPECT_THROW_MSG(format(format_str), format_error, "number is too big");
}